

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

bool __thiscall
argvParser::checkNextArgumentIfEnum(argvParser *this,argument *arg,char *nextElement)

{
  string *__lhs;
  bool bVar1;
  long lVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar3 = true;
  if (arg != (argument *)0x0) {
    __lhs = &arg->enums;
    bVar1 = std::operator!=(__lhs,"");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_f0,nextElement,(allocator *)&local_b0);
      std::operator+(&local_d0,&local_f0," ");
      lVar2 = std::__cxx11::string::find((string *)__lhs,(ulong)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      if ((lVar2 == -1) && ((arg->enums)._M_string_length != 0)) {
        std::__cxx11::string::_M_assign
                  ((string *)&(this->super_argParserAdvancedConfiguration).lastFailedArg);
        std::operator+(&local_50,"\"",&arg->argLong);
        std::operator+(&local_90,&local_50,"\" does  accept \"");
        std::operator+(&local_70,&local_90,__lhs);
        std::operator+(&local_b0,&local_70,"\" but not \"");
        std::operator+(&local_f0,&local_b0,nextElement);
        std::operator+(&local_d0,&local_f0,"\"\n");
        std::__cxx11::string::append
                  ((string *)&(this->super_argParserAdvancedConfiguration).errorMessage);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool argvParser::checkNextArgumentIfEnum(argument * arg, char *nextElement) {

    if (arg != nullptr && arg->enums != "") {
        if (arg->enums.find(string(nextElement) + " ") != string::npos)
            return true;
        else if (!arg->enums.empty()) {
            lastFailedArg = arg->argLong;
            errorMessage += "\"" + arg->argLong + "\" does  accept \"" + arg->enums + "\" but not \"" +
                            nextElement + "\"\n";
            return false;
        }


    }
    return true;
}